

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O1

void __thiscall
unodb::detail::deallocation_request::deallocate
          (deallocation_request *this,bool orphan,optional<unodb::detail::qsbr_epoch> dealloc_epoch,
          optional<bool> dealloc_epoch_single_thread_mode)

{
  byte bVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  qsbr_epoch local_12;
  bool bStack_11;
  optional<unodb::detail::qsbr_epoch> dealloc_epoch_local;
  
  bStack_11 = dealloc_epoch.super__Optional_base<unodb::detail::qsbr_epoch,_true,_true>._M_payload.
              super__Optional_payload_base<unodb::detail::qsbr_epoch>._M_engaged;
  if ((int)CONCAT71(in_register_00000031,orphan) != 0) {
    if ((bStack_11 == false) &&
       (((ushort)dealloc_epoch_single_thread_mode.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 0x100) == 0)) goto LAB_0012277a;
    if (orphan) goto LAB_0012279b;
  }
  if ((bStack_11 == true) &&
     (((ushort)dealloc_epoch_single_thread_mode.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> & 0x100) != 0)) {
    if (((ushort)dealloc_epoch_single_thread_mode.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 1) != 0) {
      bVar1 = (this->request_epoch).epoch_val;
      if (3 < bVar1) goto LAB_001227ba;
      bVar2 = qsbr_epoch::operator==(&local_12,(qsbr_epoch)(bVar1 + 1 & 3));
      if (bVar2) goto LAB_0012277a;
    }
    bVar1 = (this->request_epoch).epoch_val;
    if (3 < bVar1) {
LAB_001227ba:
      __assert_fail("epoch_val <= max",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                    ,0x9c,"void unodb::detail::qsbr_epoch::assert_invariant() const");
    }
    bVar2 = qsbr_epoch::operator==(&local_12,(qsbr_epoch)(bVar1 ^ 2));
    if (bVar2) {
LAB_0012277a:
      qsbr::deallocate(this->pointer,&this->dealloc_callback);
      LOCK();
      instance_count = instance_count + -1;
      UNLOCK();
      return;
    }
  }
LAB_0012279b:
  __assert_fail("(orphan && !dealloc_epoch.has_value() && !dealloc_epoch_single_thread_mode.has_value()) || (!orphan && dealloc_epoch.has_value() && dealloc_epoch_single_thread_mode.has_value() && ((*dealloc_epoch_single_thread_mode && *dealloc_epoch == request_epoch.advance()) || *dealloc_epoch == request_epoch.advance(2)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                ,0x5b2,
                "void unodb::detail::deallocation_request::deallocate(bool, std::optional<qsbr_epoch>, std::optional<bool>) const"
               );
}

Assistant:

inline void deallocation_request::deallocate(
#ifndef NDEBUG
    bool orphan, std::optional<qsbr_epoch> dealloc_epoch,
    std::optional<bool> dealloc_epoch_single_thread_mode
#endif
) const noexcept {
  // NOLINTNEXTLINE(readability-simplify-boolean-expr)
  UNODB_DETAIL_ASSERT((orphan && !dealloc_epoch.has_value() &&
                       !dealloc_epoch_single_thread_mode.has_value()) ||
                      (!orphan && dealloc_epoch.has_value() &&
                       dealloc_epoch_single_thread_mode.has_value() &&
                       ((*dealloc_epoch_single_thread_mode &&
                         *dealloc_epoch == request_epoch.advance()) ||
                        *dealloc_epoch == request_epoch.advance(2))));

  qsbr::deallocate(pointer
#ifndef NDEBUG
                   ,
                   dealloc_callback
#endif
  );

#ifndef NDEBUG
  instance_count.fetch_sub(1, std::memory_order_relaxed);
#endif
}